

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxNodeHeap.h
# Opt level: O3

void __thiscall maxNodeHeap::deleteNode(maxNodeHeap *this,NodeID node)

{
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_00;
  int iVar1;
  int iVar2;
  pointer ppVar3;
  pointer pQVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  mapped_type *pmVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  pointer pQVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  int __tmp;
  int iVar16;
  pointer ppVar17;
  ulong uVar18;
  int cnode;
  NodeID local_3c;
  Data local_38;
  undefined4 uStack_34;
  int local_30;
  
  this_00 = &this->m_element_index;
  local_3c = node;
  pmVar7 = std::__detail::
           _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,&local_3c);
  iVar13 = *pmVar7;
  iVar1 = (this->m_elements).
          super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
          ._M_impl.super__Vector_impl_data._M_start[iVar13].m_index;
  uVar18 = (ulong)iVar1;
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&this_00->_M_h,&local_3c);
  ppVar3 = (this->m_heap).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar17 = (this->m_heap).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_finish;
  iVar2 = ppVar3[uVar18].first;
  ppVar3[uVar18].first = ppVar17[-1].first;
  ppVar17[-1].first = iVar2;
  iVar2 = ppVar3[uVar18].second;
  ppVar3[uVar18].second = ppVar17[-1].second;
  ppVar17[-1].second = iVar2;
  pQVar4 = (this->m_elements).
           super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pQVar4[ppVar3[uVar18].second].m_index = iVar1;
  pQVar11 = (this->m_elements).
            super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar9 = (long)pQVar11 - (long)pQVar4;
  if (iVar13 != (int)(uVar9 >> 3) * -0x55555555 + -1) {
    local_30 = pQVar4[iVar13].m_index;
    uVar5._0_4_ = pQVar4[iVar13].m_data;
    uVar5._4_4_ = pQVar4[iVar13].m_key;
    pQVar4[iVar13].m_index = *(int *)((long)pQVar4 + (uVar9 - 8));
    uVar6 = *(undefined8 *)((long)pQVar4 + (uVar9 - 0x10));
    pQVar4[iVar13].m_data = (Data)(int)uVar6;
    pQVar4[iVar13].m_key = (int)((ulong)uVar6 >> 0x20);
    *(int *)((long)pQVar4 + (uVar9 - 8)) = local_30;
    *(undefined8 *)((long)pQVar4 + (uVar9 - 0x10)) = uVar5;
    pQVar4 = (this->m_elements).
             super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (this->m_heap).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start[pQVar4[iVar13].m_index].second = iVar13;
    _local_38 = CONCAT44(uVar5._4_4_,pQVar4[iVar13].m_data.node);
    pmVar7 = std::__detail::
             _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,&local_38.node);
    *pmVar7 = iVar13;
    pQVar11 = (this->m_elements).
              super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  (this->m_elements).
  super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = pQVar11 + -1;
  (**pQVar11[-1]._vptr_QElement)();
  ppVar3 = (this->m_heap).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar17 = (this->m_heap).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_finish + -1;
  (this->m_heap).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = ppVar17;
  uVar9 = (long)ppVar17 - (long)ppVar3;
  uVar12 = (long)uVar9 >> 3;
  if (uVar12 < 2) {
    return;
  }
  if ((int)uVar12 <= iVar1) {
    return;
  }
  pQVar4 = (this->m_elements).
           super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar13 = iVar1;
  do {
    iVar2 = ppVar3[iVar13].first;
    iVar14 = iVar13 * 2 + 1;
    iVar16 = iVar13 * 2 + 2;
    iVar8 = (int)(uVar9 >> 3);
    if (iVar16 < iVar8) {
      if ((ppVar3[iVar14].first < iVar2) && (ppVar3[iVar16].first < iVar2)) goto LAB_00122968;
      if (ppVar3[iVar14].first <= ppVar3[iVar16].first) {
        iVar14 = iVar16;
      }
      ppVar17 = ppVar3 + iVar14;
      iVar8 = ppVar17->first;
    }
    else {
      if (iVar8 <= iVar14) {
LAB_00122968:
        if (0 < iVar1) {
          pQVar4 = (this->m_elements).
                   super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            uVar10 = (int)uVar18 - 1;
            uVar15 = uVar10 >> 1;
            iVar13 = ppVar3[uVar15].first;
            uVar9 = uVar18 & 0xffffffff;
            if (ppVar3[uVar9].first <= iVar13) {
              return;
            }
            ppVar3[uVar15].first = ppVar3[uVar9].first;
            ppVar3[uVar9].first = iVar13;
            iVar13 = ppVar3[uVar15].second;
            ppVar3[uVar15].second = ppVar3[uVar9].second;
            ppVar3[uVar9].second = iVar13;
            pQVar4[iVar13].m_index = (int)uVar18;
            pQVar4[ppVar3[uVar15].second].m_index = uVar15;
            uVar18 = (ulong)uVar15;
          } while (1 < uVar10);
        }
        return;
      }
      iVar8 = ppVar3[iVar14].first;
      if (iVar8 <= iVar2) goto LAB_00122968;
      ppVar17 = ppVar3 + iVar14;
    }
    ppVar3[iVar13].first = iVar8;
    ppVar17->first = iVar2;
    iVar2 = ppVar3[iVar13].second;
    ppVar3[iVar13].second = ppVar17->second;
    ppVar17->second = iVar2;
    pQVar4[ppVar3[iVar13].second].m_index = iVar13;
    pQVar4[iVar2].m_index = iVar14;
    iVar13 = iVar14;
  } while( true );
}

Assistant:

inline void maxNodeHeap::deleteNode(NodeID node) {
        int element_index = m_element_index[node];
        int heap_index    = m_elements[element_index].get_index();

        m_element_index.erase(node);

        std::swap( m_heap[heap_index], m_heap[m_heap.size() - 1]);
        //update the position of its element in the element array
        m_elements[m_heap[heap_index].second].set_index(heap_index);

        // we dont want holes in the elements array -- delete the deleted element from the array
        if(element_index != (int)(m_elements.size() - 1)) {
                std::swap( m_elements[element_index], m_elements[m_elements.size() - 1]);
                m_heap[ m_elements[element_index].get_index() ].second = element_index;
                int cnode              = m_elements[element_index].get_data().node;
                m_element_index[cnode] = element_index;
        }

        m_elements.pop_back();
        m_heap.pop_back();

        if( m_heap.size() > 1 && heap_index < (int)m_heap.size() ) {
                //fix the max heap property
                siftDown(heap_index);
                siftUp(heap_index);
        }
}